

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_thread.c
# Opt level: O3

void * ares_event_thread(void *arg)

{
  int iVar1;
  timeval tv;
  timeval local_30;
  
  ares_thread_mutex_lock(*(ares_thread_mutex_t **)((long)arg + 0x10));
  if (*arg != 0) {
    do {
      ares_event_process_updates((ares_event_thread_t *)arg);
      ares_thread_mutex_unlock(*(ares_thread_mutex_t **)((long)arg + 0x10));
      ares_timeout(*(ares_channel_t **)((long)arg + 0x18),(timeval *)0x0,&local_30);
      (**(code **)(*(long *)((long)arg + 0x50) + 0x30))(arg);
      ares_thread_mutex_lock(*(ares_thread_mutex_t **)((long)arg + 0x10));
      iVar1 = *(int *)((long)arg + 0x20);
      *(undefined4 *)((long)arg + 0x20) = 0;
      ares_thread_mutex_unlock(*(ares_thread_mutex_t **)((long)arg + 0x10));
      if (iVar1 != 0) {
        ares_process_pending_write(*(ares_channel_t **)((long)arg + 0x18));
      }
      ares_thread_mutex_lock(*(ares_thread_mutex_t **)((long)arg + 0x10));
      if (*arg == 0) break;
      ares_thread_mutex_unlock(*(ares_thread_mutex_t **)((long)arg + 0x10));
      ares_process_fds(*(ares_channel_t **)((long)arg + 0x18),(ares_fd_events_t *)0x0,0,0);
      ares_thread_mutex_lock(*(ares_thread_mutex_t **)((long)arg + 0x10));
    } while (*arg != 0);
  }
  ares_event_thread_cleanup((ares_event_thread_t *)arg);
  ares_thread_mutex_unlock(*(ares_thread_mutex_t **)((long)arg + 0x10));
  return (void *)0x0;
}

Assistant:

static void *ares_event_thread(void *arg)
{
  ares_event_thread_t *e = arg;
  ares_thread_mutex_lock(e->mutex);

  while (e->isup) {
    struct timeval        tv;
    const struct timeval *tvout;
    unsigned long         timeout_ms = 0; /* 0 = unlimited */
    ares_bool_t           process_pending_write;

    ares_event_process_updates(e);

    /* Don't hold a mutex while waiting on events or calling into anything
     * that might require a c-ares channel lock since a callback could be
     * triggered cross-thread */
    ares_thread_mutex_unlock(e->mutex);

    tvout = ares_timeout(e->channel, NULL, &tv);
    if (tvout != NULL) {
      timeout_ms =
        (unsigned long)((tvout->tv_sec * 1000) + (tvout->tv_usec / 1000) + 1);
    }

    e->ev_sys->wait(e, timeout_ms);

    /* Process pending write operation */
    ares_thread_mutex_lock(e->mutex);
    process_pending_write    = e->process_pending_write;
    e->process_pending_write = ARES_FALSE;
    ares_thread_mutex_unlock(e->mutex);
    if (process_pending_write) {
      ares_process_pending_write(e->channel);
    }

    /* Relock before we loop again */
    ares_thread_mutex_lock(e->mutex);

    /* Each iteration should do timeout processing and any other cleanup
     * that may not have been performed */
    if (e->isup) {
      ares_thread_mutex_unlock(e->mutex);
      ares_process_fds(e->channel, NULL, 0, ARES_PROCESS_FLAG_NONE);
      ares_thread_mutex_lock(e->mutex);
    }
  }

  /* Lets cleanup while we're in the thread itself */
  ares_event_thread_cleanup(e);

  ares_thread_mutex_unlock(e->mutex);

  return NULL;
}